

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O0

shared_ptr<Debugger> __thiscall
EmmyDebuggerManager::RemoveDebugger(EmmyDebuggerManager *this,lua_State *L)

{
  bool bVar1;
  pointer ppVar2;
  mutex_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Debugger> sVar3;
  _Self local_50;
  _Self local_48;
  iterator it;
  UniqueIdentifyType local_30;
  UniqueIdentifyType identify;
  lock_guard<std::mutex> lock;
  lua_State *L_local;
  EmmyDebuggerManager *this_local;
  shared_ptr<Debugger> *debugger;
  
  lock._M_device = in_RDX;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&identify,(mutex_type *)&L->hook);
  local_30 = GetUniqueIdentify((EmmyDebuggerManager *)L,(lua_State *)lock._M_device);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_std::shared_ptr<Debugger>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
       ::find((map<unsigned_long_long,_std::shared_ptr<Debugger>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
               *)(L + 1),&local_30);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long_long,_std::shared_ptr<Debugger>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
       ::end((map<unsigned_long_long,_std::shared_ptr<Debugger>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>_>
              *)(L + 1));
  bVar1 = std::operator!=(&local_48,&local_50);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long_long,_std::shared_ptr<Debugger>_>_>::
             operator->(&local_48);
    std::shared_ptr<Debugger>::shared_ptr((shared_ptr<Debugger> *)this,&ppVar2->second);
    std::
    map<unsigned_long_long,std::shared_ptr<Debugger>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>>
    ::erase_abi_cxx11_((map<unsigned_long_long,std::shared_ptr<Debugger>,std::less<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,std::shared_ptr<Debugger>>>>
                        *)(L + 1),(iterator)local_48._M_node);
  }
  else {
    std::shared_ptr<Debugger>::shared_ptr((shared_ptr<Debugger> *)this,(nullptr_t)0x0);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&identify);
  sVar3.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Debugger>)sVar3.super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Debugger> EmmyDebuggerManager::RemoveDebugger(lua_State* L)
{
	std::lock_guard<std::mutex> lock(debuggerMtx);
	auto identify = GetUniqueIdentify(L);
	auto it = debuggers.find(identify);
	if (it != debuggers.end())
	{
		auto debugger = it->second;
		debuggers.erase(it);
		return debugger;
	}
	return nullptr;
}